

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEmptyLines.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckEmptyLines(Parser *this,unsigned_long max,bool checkEndOfFile)

{
  string *psVar1;
  ulong uVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  Error error;
  string line;
  
  this->m_TestsDone[0x15] = true;
  pcVar4 = (char *)operator_new__(0xff);
  bVar3 = 0;
  snprintf(pcVar4,0xff,"Empty lines = %ld max lines",max);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x15));
  operator_delete__(pcVar4);
  psVar1 = &this->m_Buffer;
  uVar2 = (this->m_Buffer)._M_string_length;
  uVar9 = 1;
  uVar7 = 0;
  uVar8 = 0;
  do {
    if (uVar2 <= uVar7) {
      return (bool)(~bVar3 & 1);
    }
    std::__cxx11::string::find((char *)psVar1,0x1554d2);
    std::__cxx11::string::substr((ulong)&line,(ulong)psVar1);
    uVar5 = uVar8 + 1;
    uVar8 = 0;
    if (line._M_string_length < 2) {
      uVar8 = uVar5;
    }
    if (max < uVar8) {
      if (!checkEndOfFile) {
        lVar6 = std::__cxx11::string::find_first_not_of((char *)psVar1,0x162a14);
        if (lVar6 == -1) goto LAB_00144747;
      }
      error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
      error.description._M_string_length = 0;
      error.description.field_2._M_local_buf[0] = '\0';
      error.number = 0x15;
      error.line = uVar9;
      error.line2 = uVar9;
      std::__cxx11::string::assign((char *)&error.description);
      pcVar4 = (char *)operator_new__(10);
      snprintf(pcVar4,10,"%ld",uVar8);
      std::__cxx11::string::append((char *)&error.description);
      std::__cxx11::string::append((char *)&error.description);
      operator_delete__(pcVar4);
      pcVar4 = (char *)operator_new__(10);
      snprintf(pcVar4,10,"%ld",max);
      std::__cxx11::string::append((char *)&error.description);
      std::__cxx11::string::append((char *)&error.description);
      operator_delete__(pcVar4);
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,&error);
      std::__cxx11::string::~string((string *)&error.description);
      bVar3 = 1;
    }
LAB_00144747:
    uVar9 = uVar9 + 1;
    uVar7 = uVar7 + 1 + line._M_string_length;
    std::__cxx11::string::~string((string *)&line);
  } while( true );
}

Assistant:

bool Parser::CheckEmptyLines(unsigned long max, bool checkEndOfFile)
{
  m_TestsDone[EMPTYLINES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Empty lines = %ld max lines",max);
  m_TestsDescription[EMPTYLINES] = val;
  delete [] val;

  bool hasError = false;
  auto total = static_cast<unsigned long>(m_Buffer.size());
  unsigned long i = 0;
  unsigned long j = 1;
  unsigned long empty = 0;
  while(i<total)
    {
    // extract the line
    std::string line = m_Buffer.substr(i+1,m_Buffer.find("\n",i+1)-i-1);

    // if we have \n\r
    if(line.length() <= 1)
      {
      empty++;
      }
    else
      {
      empty = 0;
      }

    if(empty>max)
      {
      bool valid = true;
      // Check if we are at the end of the file
      if(!checkEndOfFile)
        {
        if(m_Buffer.find_first_not_of("\r\n ",i) == std::string::npos)
          {
          valid = false;
          }
        }

      if(valid)
        {
        Error error;
        error.line = j;
        error.line2 = error.line;
        error.number = EMPTYLINES;
        error.description = "Empty lines exceed ";
        constexpr size_t length = 10;
        char* localval = new char[length];
        snprintf(localval,length,"%ld",empty);
        error.description += localval;
        error.description += " (max=";
        delete [] localval;
        localval = new char[length];
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        delete [] localval;
        m_ErrorList.push_back(error);
        hasError = true;
        }
      }
    j++;
    i += static_cast<unsigned long>(line.length())+1;
    }
  return !hasError;
}